

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O1

void __thiscall deqp::gls::ub::ShaderInterface::~ShaderInterface(ShaderInterface *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  StructType *this_00;
  UniformBlock *pUVar2;
  pointer pcVar3;
  pointer ppSVar4;
  pointer ppUVar5;
  
  ppSVar4 = (this->m_structs).
            super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar4 !=
      (this->m_structs).
      super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppSVar4;
      if (this_00 != (StructType *)0x0) {
        StructType::~StructType(this_00);
        operator_delete(this_00,0x38);
      }
      ppSVar4 = ppSVar4 + 1;
    } while (ppSVar4 !=
             (this->m_structs).
             super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  for (ppUVar5 = (this->m_uniformBlocks).
                 super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppUVar5 !=
      (this->m_uniformBlocks).
      super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppUVar5 = ppUVar5 + 1) {
    pUVar2 = *ppUVar5;
    if (pUVar2 != (UniformBlock *)0x0) {
      std::vector<deqp::gls::ub::Uniform,_std::allocator<deqp::gls::ub::Uniform>_>::~vector
                (&pUVar2->m_uniforms);
      pcVar3 = (pUVar2->m_instanceName)._M_dataplus._M_p;
      paVar1 = &(pUVar2->m_instanceName).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      pcVar3 = (pUVar2->m_blockName)._M_dataplus._M_p;
      paVar1 = &(pUVar2->m_blockName).field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar1) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      operator_delete(pUVar2,0x60);
    }
  }
  ppUVar5 = (this->m_uniformBlocks).
            super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppUVar5 != (pointer)0x0) {
    operator_delete(ppUVar5,(long)(this->m_uniformBlocks).
                                  super__Vector_base<deqp::gls::ub::UniformBlock_*,_std::allocator<deqp::gls::ub::UniformBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppUVar5
                   );
  }
  ppSVar4 = (this->m_structs).
            super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->m_structs).
                                  super__Vector_base<deqp::gls::ub::StructType_*,_std::allocator<deqp::gls::ub::StructType_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
    return;
  }
  return;
}

Assistant:

ShaderInterface::~ShaderInterface (void)
{
	for (std::vector<StructType*>::iterator i = m_structs.begin(); i != m_structs.end(); i++)
		delete *i;

	for (std::vector<UniformBlock*>::iterator i = m_uniformBlocks.begin(); i != m_uniformBlocks.end(); i++)
		delete *i;
}